

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O2

ktx_size_t ktxTexture1_calcDataSizeLevels(ktxTexture1 *This,ktx_uint32_t levels)

{
  ktx_size_t kVar1;
  ktx_uint32_t level;
  ktx_size_t kVar2;
  
  if (This == (ktxTexture1 *)0x0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture1.c"
                  ,0x36e,"ktx_size_t ktxTexture1_calcDataSizeLevels(ktxTexture1 *, ktx_uint32_t)");
  }
  if (levels <= This->numLevels) {
    kVar2 = 0;
    for (level = 0; levels != level; level = level + 1) {
      kVar1 = ktxTexture_calcLevelSize((ktxTexture *)This,level,KTX_FORMAT_VERSION_ONE);
      kVar2 = kVar2 + kVar1;
    }
    return kVar2;
  }
  __assert_fail("levels <= This->numLevels",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture1.c"
                ,0x36f,"ktx_size_t ktxTexture1_calcDataSizeLevels(ktxTexture1 *, ktx_uint32_t)");
}

Assistant:

ktx_size_t
ktxTexture1_calcDataSizeLevels(ktxTexture1* This, ktx_uint32_t levels)
{
    ktx_uint32_t i;
    ktx_size_t dataSize = 0;

    assert(This != NULL);
    assert(levels <= This->numLevels);
    for (i = 0; i < levels; i++) {
        ktx_size_t levelSize = ktxTexture_calcLevelSize(ktxTexture(This), i,
                                                        KTX_FORMAT_VERSION_ONE);
        /* mipPadding. NOTE: this adds padding after the last level too. */
        #if KTX_GL_UNPACK_ALIGNMENT != 4
            dataSize += _KTX_PAD4(levelSize);
        #else
            dataSize += levelSize;
        #endif
    }
    return dataSize;
}